

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O0

LogicProgram * __thiscall
Clasp::Asp::LogicProgram::addMinimize(LogicProgram *this,weight_t prio,WeightLitSpan *lits)

{
  weight_t wVar1;
  bool bVar2;
  Atom_t atomId;
  Min *pMVar3;
  iterator ppMVar4;
  iterator ppMVar5;
  Min **ppMVar6;
  WeightLit_t *pos;
  WeightLit_t *first;
  LogicProgram *pLVar7;
  Span<Potassco::WeightLit_t> *in_RDX;
  weight_t in_ESI;
  LogicProgram *in_RDI;
  iterator end;
  iterator wIt;
  iterator it;
  SingleOwnerPtr<Clasp::Asp::LogicProgram::Min,_Clasp::DeleteObject> n;
  int in_stack_fffffffffffffed8;
  Key in_stack_fffffffffffffedc;
  LogicProgram *in_stack_fffffffffffffee0;
  LogicProgram *this_00;
  WeightLit_t *in_stack_fffffffffffffee8;
  pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>
  *in_stack_fffffffffffffef0;
  WLitVec *this_01;
  LogicProgram *local_58;
  Min *local_40;
  Min **local_38;
  SingleOwnerPtr<Clasp::Asp::LogicProgram::Min,_Clasp::DeleteObject> local_20;
  Span<Potassco::WeightLit_t> *local_18;
  weight_t local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  bVar2 = ProgramBuilder::frozen(&in_RDI->super_ProgramBuilder);
  if (!bVar2) {
    pMVar3 = (Min *)operator_new(0x18);
    *(undefined8 *)pMVar3 = 0;
    (pMVar3->lits).ebo_.buf = (pointer)0x0;
    (pMVar3->lits).ebo_.size = 0;
    (pMVar3->lits).ebo_.cap = 0;
    Min::Min((Min *)0x17cfdd);
    SingleOwnerPtr<Clasp::Asp::LogicProgram::Min,_Clasp::DeleteObject>::SingleOwnerPtr
              (&local_20,pMVar3,Acquire);
    wVar1 = local_c;
    pMVar3 = SingleOwnerPtr<Clasp::Asp::LogicProgram::Min,_Clasp::DeleteObject>::operator->
                       ((SingleOwnerPtr<Clasp::Asp::LogicProgram::Min,_Clasp::DeleteObject> *)
                        0x17d01c);
    pMVar3->prio = wVar1;
    ppMVar4 = bk_lib::
              pod_vector<Clasp::Asp::LogicProgram::Min_*,_std::allocator<Clasp::Asp::LogicProgram::Min_*>_>
              ::begin(&in_RDI->minimize_);
    ppMVar5 = bk_lib::
              pod_vector<Clasp::Asp::LogicProgram::Min_*,_std::allocator<Clasp::Asp::LogicProgram::Min_*>_>
              ::end(&in_RDI->minimize_);
    local_40 = SingleOwnerPtr<Clasp::Asp::LogicProgram::Min,_Clasp::DeleteObject>::get
                         ((SingleOwnerPtr<Clasp::Asp::LogicProgram::Min,_Clasp::DeleteObject> *)
                          0x17d080);
    ppMVar6 = std::
              lower_bound<Clasp::Asp::LogicProgram::Min**,Clasp::Asp::LogicProgram::Min*,Clasp::Asp::LogicProgram::CmpMin>
                        (ppMVar4,ppMVar5,&local_40);
    local_38 = ppMVar6;
    ppMVar4 = bk_lib::
              pod_vector<Clasp::Asp::LogicProgram::Min_*,_std::allocator<Clasp::Asp::LogicProgram::Min_*>_>
              ::end(&in_RDI->minimize_);
    if ((ppMVar6 == ppMVar4) || ((*local_38)->prio != local_c)) {
      SingleOwnerPtr<Clasp::Asp::LogicProgram::Min,_Clasp::DeleteObject>::operator->
                ((SingleOwnerPtr<Clasp::Asp::LogicProgram::Min,_Clasp::DeleteObject> *)0x17d12f);
      Potassco::begin<Potassco::WeightLit_t>(local_18);
      Potassco::end<Potassco::WeightLit_t>((Span<Potassco::WeightLit_t> *)0x17d165);
      bk_lib::pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>>::
      assign<Potassco::WeightLit_t_const*>
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 (WeightLit_t *)in_stack_fffffffffffffee0);
      SingleOwnerPtr<Clasp::Asp::LogicProgram::Min,_Clasp::DeleteObject>::get
                ((SingleOwnerPtr<Clasp::Asp::LogicProgram::Min,_Clasp::DeleteObject> *)0x17d1af);
      bk_lib::
      pod_vector<Clasp::Asp::LogicProgram::Min_*,_std::allocator<Clasp::Asp::LogicProgram::Min_*>_>
      ::insert((pod_vector<Clasp::Asp::LogicProgram::Min_*,_std::allocator<Clasp::Asp::LogicProgram::Min_*>_>
                *)in_stack_fffffffffffffee0,
               (iterator)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (Min **)0x17d1da);
      SingleOwnerPtr<Clasp::Asp::LogicProgram::Min,_Clasp::DeleteObject>::release
                ((SingleOwnerPtr<Clasp::Asp::LogicProgram::Min,_Clasp::DeleteObject> *)
                 in_stack_fffffffffffffee0);
      upStat(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
    }
    else {
      this_01 = &(*local_38)->lits;
      bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::end
                (this_01);
      pos = Potassco::begin<Potassco::WeightLit_t>(local_18);
      first = Potassco::end<Potassco::WeightLit_t>((Span<Potassco::WeightLit_t> *)0x17d296);
      bk_lib::pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>>::
      insert<Potassco::WeightLit_t_const*>
                (this_01,pos,first,in_stack_fffffffffffffee8,
                 (type_conflict *)in_stack_fffffffffffffee0);
    }
    local_58 = (LogicProgram *)Potassco::begin<Potassco::WeightLit_t>(local_18);
    pLVar7 = (LogicProgram *)
             Potassco::end<Potassco::WeightLit_t>((Span<Potassco::WeightLit_t> *)0x17d2ed);
    this_00 = pLVar7;
    for (; local_58 != pLVar7; local_58 = (LogicProgram *)&(local_58->super_ProgramBuilder).ctx_) {
      atomId = Potassco::atom((WeightLit_t *)0x17d320);
      resize(this_00,atomId);
    }
    SingleOwnerPtr<Clasp::Asp::LogicProgram::Min,_Clasp::DeleteObject>::~SingleOwnerPtr
              ((SingleOwnerPtr<Clasp::Asp::LogicProgram::Min,_Clasp::DeleteObject> *)0x17d35e);
    return in_RDI;
  }
  Potassco::fail(-2,
                 "LogicProgram &Clasp::Asp::LogicProgram::addMinimize(weight_t, const Potassco::WeightLitSpan &)"
                 ,0x349,"!frozen()","Can\'t update frozen program!",0);
}

Assistant:

LogicProgram& LogicProgram::addMinimize(weight_t prio, const Potassco::WeightLitSpan& lits) {
	check_not_frozen();
	SingleOwnerPtr<Min> n(new Min());
	n->prio = prio;
	MinList::iterator it = std::lower_bound(minimize_.begin(), minimize_.end(), n.get(), CmpMin());
	if (it == minimize_.end() || (*it)->prio != prio) {
		n->lits.assign(Potassco::begin(lits), Potassco::end(lits));
		minimize_.insert(it, n.get());
		n.release();
		upStat(RuleStats::Minimize);
	}
	else {
		(*it)->lits.insert((*it)->lits.end(), Potassco::begin(lits), Potassco::end(lits));
	}
	// Touch all atoms in minimize -> these are input atoms even if they won't occur in a head.
	for (Potassco::WeightLitSpan::iterator wIt = Potassco::begin(lits), end = Potassco::end(lits); wIt != end; ++wIt) {
		resize(Potassco::atom(*wIt));
	}
	return *this;
}